

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O3

void __thiscall
nuraft::raft_server::pause_state_machine_exeuction(raft_server *this,size_t timeout_ms)

{
  element_type *peVar1;
  int iVar2;
  uint64_t uVar3;
  char *pcVar4;
  char *pcVar5;
  string local_88;
  undefined1 local_68 [24];
  __native_type local_50;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar5 = "ACTIVE";
      if (((this->sm_commit_paused_)._M_base._M_i & 1U) != 0) {
        pcVar5 = "PAUSED";
      }
      pcVar4 = "SLEEPING";
      if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
        pcVar4 = "RUNNING";
      }
      msg_if_given_abi_cxx11_
                ((string *)local_68,
                 "pause state machine execution, previously %s, state machine %s, timeout %zu ms",
                 pcVar5,pcVar4,timeout_ms);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"pause_state_machine_exeuction",0x375,(string *)local_68);
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_);
      }
    }
  }
  LOCK();
  (this->sm_commit_paused_)._M_base._M_i = true;
  UNLOCK();
  if (timeout_ms != 0) {
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = 0;
    local_68[0x10] = '\x01';
    local_50.__align = 0;
    local_50._8_8_ = 0;
    local_50._16_8_ = 0;
    local_50.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_50.__data.__list.__next = (__pthread_internal_list *)0x0;
    timer_helper::reset((timer_helper *)local_68);
    LOCK();
    (this->ea_sm_commit_exec_in_progress_->status)._M_i = idle;
    UNLOCK();
    if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
      EventAwaiter::wait_us(this->ea_sm_commit_exec_in_progress_,timeout_ms * 1000);
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
      if (3 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        uVar3 = timer_helper::get_ms((timer_helper *)local_68);
        pcVar5 = "SLEEPING";
        if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
          pcVar5 = "RUNNING";
        }
        msg_if_given_abi_cxx11_(&local_88,"waited %lu ms, state machine %s",uVar3,pcVar5);
        (**(code **)(*(long *)peVar1 + 0x40))
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"pause_state_machine_exeuction",0x380,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
    }
  }
  return;
}

Assistant:

void raft_server::pause_state_machine_exeuction(size_t timeout_ms) {
    p_in( "pause state machine execution, previously %s, state machine %s, "
          "timeout %zu ms",
          sm_commit_paused_ ? "PAUSED" : "ACTIVE",
          sm_commit_exec_in_progress_ ? "RUNNING" : "SLEEPING",
          timeout_ms );
    sm_commit_paused_ = true;

    if (!timeout_ms) {
        return;
    }

    timer_helper timer;
    wait_for_state_machine_pause(timeout_ms);
    p_in( "waited %" PRIu64 " ms, state machine %s",
          timer.get_ms(),
          sm_commit_exec_in_progress_ ? "RUNNING" : "SLEEPING" );
}